

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O2

FT_Error af_latin_hints_compute_segments(AF_GlyphHints hints,AF_Dimension dim)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  FT_Char FVar7;
  FT_Short FVar8;
  FT_Short FVar9;
  FT_Short FVar10;
  AF_AxisHintsRec *pAVar11;
  AF_Direction AVar12;
  AF_Point_conflict point;
  AF_Point_conflict pAVar13;
  AF_Segment_conflict pAVar14;
  AF_Segment_conflict pAVar15;
  ulong uVar16;
  ulong uVar17;
  AF_Segment_conflict pAVar18;
  byte bVar19;
  byte bVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  short sVar25;
  long lVar26;
  long lVar27;
  short sVar28;
  long lVar29;
  long lVar30;
  AF_Direction AVar31;
  AF_Direction AVar32;
  AF_Point_conflict pAVar33;
  long lVar34;
  uint uVar35;
  bool bVar36;
  bool bVar37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar42 [16];
  uint local_f4;
  uint local_f0;
  FT_Error local_ec;
  uint local_e8;
  uint local_e4;
  long local_e0;
  long local_d8;
  AF_Direction local_cc;
  long local_c8;
  long local_c0;
  AF_Segment_conflict local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  AF_AxisHintsRec *local_98;
  FT_Memory local_90;
  undefined8 local_88;
  AF_Point_conflict *local_80;
  AF_Point_conflict *local_78;
  AF_Point_conflict local_70;
  undefined1 local_68 [16];
  undefined8 uStack_58;
  undefined7 uStack_50;
  undefined4 local_49;
  undefined4 uStack_45;
  undefined4 uStack_41;
  undefined4 uStack_3d;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined2 uVar45;
  
  bVar38 = 0;
  local_98 = hints->axis + dim;
  local_90 = hints->memory;
  local_78 = hints->contours;
  iVar3 = hints->num_contours;
  local_b0 = (ulong)*(uint *)&hints->metrics[1].style_class / 0xe;
  uStack_45 = 0;
  uStack_41 = 0;
  uStack_3d = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_49 = 0;
  local_68 = (undefined1  [16])0x0;
  AVar32 = hints->axis[dim].major_dir;
  local_cc = -AVar32;
  if (~AF_DIR_LEFT < AVar32) {
    local_cc = AVar32;
  }
  local_98->num_segments = 0;
  pAVar13 = hints->points;
  pAVar33 = pAVar13 + hints->num_points;
  if (dim == AF_DIMENSION_HORZ) {
    for (; pAVar13 < pAVar33; pAVar13 = pAVar13 + 1) {
      uVar16._0_2_ = pAVar13->fx;
      uVar16._2_2_ = pAVar13->fy;
      uVar16._4_4_ = *(undefined4 *)&pAVar13->field_0x1c;
      uVar45 = (undefined2)((uint)uVar16._4_4_ >> 0x10);
      auVar44._8_4_ = 0;
      auVar44._0_8_ = uVar16;
      auVar44._12_2_ = uVar45;
      auVar44._14_2_ = uVar45;
      auVar43._12_4_ = auVar44._12_4_;
      auVar43._8_2_ = 0;
      auVar43._0_8_ = uVar16;
      auVar43._10_2_ = (short)uVar16._4_4_;
      auVar42._10_6_ = auVar43._10_6_;
      auVar42._8_2_ = (short)uVar16._4_4_;
      auVar42._0_8_ = uVar16;
      auVar6._4_8_ = auVar42._8_8_;
      auVar6._2_2_ = uVar16._2_2_;
      auVar6._0_2_ = uVar16._2_2_;
      *(int *)&pAVar13->u = (int)(short)(undefined2)uVar16;
      *(uint *)((long)&pAVar13->u + 4) = -(uint)((short)(undefined2)uVar16 < 0);
      *(int *)&pAVar13->v = auVar6._0_4_ >> 0x10;
      *(uint *)((long)&pAVar13->v + 4) = -(uint)(auVar6._0_4_ < 0);
    }
  }
  else {
    for (; pAVar13 < pAVar33; pAVar13 = pAVar13 + 1) {
      uVar23._0_2_ = pAVar13->fx;
      uVar23._2_2_ = pAVar13->fy;
      uVar23._4_4_ = *(undefined4 *)&pAVar13->field_0x1c;
      uVar45 = (undefined2)((uint)uVar23._4_4_ >> 0x10);
      auVar41._8_4_ = 0;
      auVar41._0_8_ = uVar23;
      auVar41._12_2_ = uVar45;
      auVar41._14_2_ = uVar45;
      auVar40._12_4_ = auVar41._12_4_;
      auVar40._8_2_ = 0;
      auVar40._0_8_ = uVar23;
      auVar40._10_2_ = (short)uVar23._4_4_;
      auVar39._10_6_ = auVar40._10_6_;
      auVar39._8_2_ = (short)uVar23._4_4_;
      auVar39._0_8_ = uVar23;
      auVar5._4_8_ = auVar39._8_8_;
      auVar5._2_2_ = uVar23._2_2_;
      auVar5._0_2_ = uVar23._2_2_;
      *(int *)&pAVar13->u = auVar5._0_4_ >> 0x10;
      *(uint *)((long)&pAVar13->u + 4) = -(uint)(auVar5._0_4_ < 0);
      *(int *)&pAVar13->v = (int)(short)(undefined2)uVar23;
      *(uint *)((long)&pAVar13->v + 4) = -(uint)((short)(undefined2)uVar23 < 0);
    }
  }
  local_80 = local_78 + iVar3;
  local_b8 = hints->axis[dim].embedded.segments;
  pAVar15 = (AF_Segment_conflict)0x0;
  AVar32 = local_cc;
LAB_00229143:
  if (local_78 < local_80) {
    pAVar13 = *local_78;
    bVar20 = pAVar13->prev->out_dir;
    bVar19 = (char)bVar20 >> 7;
    pAVar33 = pAVar13;
    if ((local_cc == (uint)(byte)((bVar20 ^ bVar19) - bVar19)) &&
       (bVar20 = pAVar13->out_dir >> 7,
       local_cc == (uint)(byte)((pAVar13->out_dir ^ bVar20) - bVar20))) {
      do {
        pAVar33 = pAVar33->prev;
        bVar20 = pAVar33->out_dir >> 7;
        if (local_cc != (uint)(byte)((pAVar33->out_dir ^ bVar20) - bVar20)) {
          pAVar33 = pAVar33->next;
          break;
        }
      } while (pAVar33 != pAVar13);
    }
    lVar30 = -32000;
    lVar21 = 32000;
    bVar37 = false;
    lVar26 = 32000;
    lVar29 = -32000;
    local_f0 = 0;
    local_f4 = 0;
    lVar22 = 32000;
    lVar24 = -32000;
    local_88 = 0;
    pAVar14 = (AF_Segment_conflict)0x0;
    local_e0 = 32000;
    local_d8 = -32000;
    local_c0 = 32000;
    local_c8 = -32000;
    local_e4 = 0;
    local_e8 = 0;
    local_a0 = 32000;
    local_a8 = -32000;
    pAVar18 = pAVar15;
    local_70 = pAVar33;
    do {
      pAVar11 = local_98;
      if (bVar37) {
        lVar34 = pAVar33->u;
        if (lVar34 < lVar21) {
          lVar21 = lVar34;
        }
        if (lVar30 < lVar34) {
          lVar30 = lVar34;
        }
        lVar34 = pAVar33->v;
        lVar27 = lVar26;
        if (lVar34 < lVar26) {
          lVar27 = lVar34;
        }
        uVar2 = pAVar33->flags;
        if (lVar34 < lVar26) {
          local_f0 = (uint)uVar2;
        }
        if (lVar29 < lVar34) {
          local_f4 = (uint)uVar2;
          lVar29 = lVar34;
        }
        lVar26 = lVar22;
        if (lVar34 < lVar22) {
          lVar26 = lVar34;
        }
        if (lVar34 <= lVar24) {
          lVar34 = lVar24;
        }
        if ((uVar2 & 3) != 0) {
          lVar34 = lVar24;
          lVar26 = lVar22;
        }
        lVar22 = lVar26;
        lVar24 = lVar34;
        lVar26 = lVar27;
        if ((AVar32 == pAVar33->out_dir) && (pAVar33 != local_70)) {
          bVar37 = false;
          pAVar15 = pAVar18;
          pAVar18 = pAVar14;
        }
        else {
          sVar25 = (short)lVar27;
          sVar28 = (short)lVar29;
          if ((pAVar14 != (AF_Segment_conflict)0x0) && (pAVar18->first == pAVar14->last)) {
            if (pAVar14->last->in_dir == pAVar33->in_dir) {
              if (local_e0 < lVar21) {
                lVar21 = local_e0;
              }
              if (lVar30 < local_d8) {
                lVar30 = local_d8;
              }
              if (local_c0 < lVar27) {
                local_f0 = local_e4;
                lVar27 = local_c0;
              }
              if (lVar29 < local_c8) {
                local_f4 = local_e8;
                lVar29 = local_c8;
              }
              if (local_a0 < lVar22) {
                lVar22 = local_a0;
              }
              if (lVar24 < local_a8) {
                lVar24 = local_a8;
              }
              pAVar14->last = pAVar33;
              pAVar14->pos = (FT_Short)((uint)((int)lVar21 + (int)lVar30) >> 1);
              pAVar14->delta = (FT_Short)((uint)((int)lVar30 - (int)lVar21) >> 1);
              pAVar14->flags =
                   pAVar14->flags & 0xfe |
                   (lVar24 - lVar22 < (long)local_b0 && ((local_f4 | local_f0) & 3) != 0);
              pAVar14->min_coord = (short)lVar27;
              pAVar14->max_coord = (short)lVar29;
              pAVar14->height = (short)lVar29 - (short)lVar27;
            }
            else {
              uVar16 = local_c8 - local_c0;
              uVar23 = -uVar16;
              if (0 < (long)uVar16) {
                uVar23 = uVar16;
              }
              uVar17 = lVar29 - lVar27;
              uVar16 = -uVar17;
              if (0 < (long)uVar17) {
                uVar16 = uVar17;
              }
              if (uVar16 < uVar23) {
                if (lVar21 < local_e0) {
                  local_e0 = lVar21;
                }
                if (local_d8 < lVar30) {
                  local_d8 = lVar30;
                }
                pAVar14->last = pAVar33;
                pAVar14->pos = (FT_Short)((uint)((int)local_e0 + (int)local_d8) >> 1);
                pAVar14->delta = (FT_Short)((uint)((int)local_d8 - (int)local_e0) >> 1);
              }
              else {
                if (local_e0 < lVar21) {
                  lVar21 = local_e0;
                }
                if (lVar30 < local_d8) {
                  lVar30 = local_d8;
                }
                pAVar18->last = pAVar33;
                pAVar18->pos = (FT_Short)((uint)((int)lVar21 + (int)lVar30) >> 1);
                pAVar18->delta = (FT_Short)((uint)((int)lVar30 - (int)lVar21) >> 1);
                if ((((local_f4 | local_f0) & 3) != 0) && (lVar24 - lVar22 < (long)local_b0)) {
                  pAVar18->flags = pAVar18->flags | 1;
                }
                pAVar18->min_coord = sVar25;
                pAVar18->max_coord = sVar28;
                pAVar18->height = sVar28 - sVar25;
                pAVar15 = pAVar14;
                for (lVar26 = 10; local_e8 = local_f4, local_e4 = local_f0, local_e0 = lVar21,
                    local_d8 = lVar30, local_c8 = lVar29, local_c0 = lVar27, local_a8 = lVar24,
                    local_a0 = lVar22, lVar26 != 0; lVar26 = lVar26 + -1) {
                  FVar7 = pAVar18->dir;
                  FVar8 = pAVar18->pos;
                  FVar9 = pAVar18->delta;
                  FVar10 = pAVar18->min_coord;
                  pAVar15->flags = pAVar18->flags;
                  pAVar15->dir = FVar7;
                  pAVar15->pos = FVar8;
                  pAVar15->delta = FVar9;
                  pAVar15->min_coord = FVar10;
                  pAVar18 = (AF_Segment_conflict)((long)pAVar18 + (ulong)bVar38 * -0x10 + 8);
                  pAVar15 = (AF_Segment_conflict)((long)pAVar15 + (ulong)bVar38 * -0x10 + 8);
                }
              }
            }
            local_98->num_segments = local_98->num_segments - 1;
            pAVar18 = (AF_Segment_conflict)0x0;
            lVar26 = lVar27;
            goto LAB_002292ca;
          }
          pAVar18->last = pAVar33;
          pAVar18->pos = (FT_Short)((uint)((int)lVar21 + (int)lVar30) >> 1);
          pAVar18->delta = (FT_Short)((uint)((int)lVar30 - (int)lVar21) >> 1);
          bVar37 = true;
          if ((((local_f4 | local_f0) & 3) != 0) && (lVar24 - lVar22 < (long)local_b0)) {
            pAVar18->flags = pAVar18->flags | 1;
          }
          pAVar18->min_coord = sVar25;
          pAVar18->max_coord = sVar28;
          pAVar18->height = sVar28 - sVar25;
          pAVar14 = (AF_Segment_conflict)(ulong)local_f4;
          pAVar15 = (AF_Segment_conflict)0x0;
          local_e8 = local_f4;
          local_e4 = local_f0;
          local_e0 = lVar21;
          local_d8 = lVar30;
          local_c8 = lVar29;
          local_c0 = lVar27;
          local_a8 = lVar24;
          local_a0 = lVar22;
        }
      }
      else {
LAB_002292ca:
        bVar37 = true;
        pAVar15 = pAVar18;
        pAVar18 = pAVar14;
      }
      if (pAVar33 == local_70) {
        bVar36 = (char)local_88 != '\0';
        local_88 = CONCAT71((int7)((ulong)pAVar14 >> 8),1);
        if (bVar36) goto LAB_0022975a;
      }
      pAVar14 = pAVar18;
      if (bVar37) {
        cVar1 = pAVar33->out_dir;
        AVar31 = (AF_Direction)cVar1;
        AVar12 = -AVar31;
        if (~AF_DIR_LEFT < AVar31) {
          AVar12 = AVar31;
        }
        if ((AVar12 == local_cc) || (bVar37 = false, pAVar33 == pAVar33->prev)) {
          uVar35 = local_98->num_segments;
          if (1000 < uVar35) {
            local_98->num_segments = 0;
            return 0;
          }
          local_ec = 0;
          if (uVar35 < 0x12) {
            pAVar15 = local_98->segments;
            if (local_98->segments == (AF_Segment_conflict)0x0) {
              local_98->segments = local_b8;
              local_98->max_segments = 0x12;
              pAVar15 = local_b8;
            }
          }
          else {
            uVar4 = local_98->max_segments;
            pAVar15 = local_98->segments;
            if (uVar4 <= uVar35) {
              uVar35 = uVar4 + (uVar4 >> 2) + 4;
              if (pAVar15 == local_b8) {
                pAVar15 = (AF_Segment_conflict)
                          ft_mem_realloc(local_90,0x50,0,(ulong)uVar35,(void *)0x0,&local_ec);
                pAVar11->segments = pAVar15;
                if (local_ec != 0) {
                  return local_ec;
                }
                memcpy(pAVar15,local_b8,0x5a0);
                pAVar15 = pAVar11->segments;
              }
              else {
                pAVar15 = (AF_Segment_conflict)
                          ft_mem_realloc(local_90,0x50,(ulong)uVar4,(ulong)uVar35,pAVar15,&local_ec)
                ;
                pAVar11->segments = pAVar15;
                if (local_ec != 0) {
                  return local_ec;
                }
              }
              pAVar11->max_segments = uVar35;
              uVar35 = pAVar11->num_segments;
            }
          }
          pAVar11->num_segments = uVar35 + 1;
          pAVar14 = pAVar15 + uVar35;
          pAVar14->flags = '\0';
          *(undefined8 *)&pAVar14->dir = local_68._0_8_;
          *(undefined8 *)((long)&pAVar14->max_coord + 1) = local_68._8_8_;
          *(undefined8 *)((long)&pAVar14->edge + 1) = uStack_58;
          *(ulong *)((long)&pAVar14->edge_next + 1) = CONCAT17((undefined1)local_49,uStack_50);
          *(undefined4 *)&pAVar14->link = local_49;
          *(undefined4 *)((long)&pAVar14->link + 4) = uStack_45;
          *(undefined4 *)&pAVar14->serif = uStack_41;
          *(undefined4 *)((long)&pAVar14->serif + 4) = uStack_3d;
          pAVar14->score = 32000;
          pAVar14->len = 0;
          pAVar15 = pAVar15 + uVar35;
          pAVar14->dir = cVar1;
          pAVar14->first = pAVar33;
          pAVar14->last = pAVar33;
          pAVar14 = pAVar14 + -1;
          if (pAVar18 == (AF_Segment_conflict)0x0) {
            pAVar14 = pAVar18;
          }
          lVar21 = pAVar33->u;
          lVar26 = pAVar33->v;
          uVar2 = pAVar33->flags;
          bVar37 = (uVar2 & 3) == 0;
          lVar22 = 32000;
          if (bVar37) {
            lVar22 = lVar26;
          }
          lVar24 = -32000;
          if (bVar37) {
            lVar24 = lVar26;
          }
          local_f4 = (uint)uVar2;
          lVar29 = lVar26;
          lVar30 = lVar21;
          local_f0 = local_f4;
          AVar32 = AVar31;
          if (pAVar33 == pAVar33->prev) {
            pAVar15->pos = (FT_Short)lVar21;
            if ((uVar2 & 3) != 0) {
              pAVar15->flags = '\x01';
            }
            pAVar15->min_coord = (FT_Short)lVar26;
            pAVar15->max_coord = (FT_Short)lVar26;
            pAVar15->height = 0;
            pAVar15 = (AF_Segment_conflict)0x0;
            bVar37 = false;
          }
          else {
            bVar37 = true;
          }
        }
      }
      else {
        bVar37 = true;
      }
      pAVar33 = pAVar33->next;
      pAVar18 = pAVar15;
    } while( true );
  }
  pAVar15 = local_98->segments;
  if (pAVar15 == (AF_Segment_conflict)0x0) {
    pAVar14 = (AF_Segment_conflict)0x0;
  }
  else {
    pAVar14 = pAVar15 + local_98->num_segments;
  }
  do {
    if (pAVar14 <= pAVar15) {
      return 0;
    }
    pAVar13 = pAVar15->last;
    lVar21 = pAVar15->first->v;
    lVar26 = pAVar13->v;
    lVar22 = pAVar15->first->prev->v;
    if (lVar21 < lVar26) {
      if (lVar22 < lVar21) {
        pAVar15->height = pAVar15->height + (short)((uint)((int)lVar21 - (int)lVar22) >> 1);
      }
      lVar21 = pAVar13->next->v;
      uVar23 = lVar21 - lVar26;
      if (uVar23 != 0 && lVar26 <= lVar21) {
LAB_00229810:
        pAVar15->height = pAVar15->height + (short)(uVar23 >> 1);
      }
    }
    else {
      if (lVar21 < lVar22) {
        pAVar15->height = pAVar15->height + (short)((uint)((int)lVar22 - (int)lVar21) >> 1);
      }
      lVar21 = pAVar13->next->v;
      uVar23 = lVar26 - lVar21;
      if (uVar23 != 0 && lVar21 <= lVar26) goto LAB_00229810;
    }
    pAVar15 = pAVar15 + 1;
  } while( true );
LAB_0022975a:
  local_78 = local_78 + 1;
  goto LAB_00229143;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_hints_compute_segments( AF_GlyphHints  hints,
                                   AF_Dimension   dim )
  {
    AF_LatinMetrics  metrics       = (AF_LatinMetrics)hints->metrics;
    AF_AxisHints     axis          = &hints->axis[dim];
    FT_Memory        memory        = hints->memory;
    FT_Error         error         = FT_Err_Ok;
    AF_Segment       segment       = NULL;
    AF_SegmentRec    seg0;
    AF_Point*        contour       = hints->contours;
    AF_Point*        contour_limit = contour + hints->num_contours;
    AF_Direction     major_dir, segment_dir;

    FT_Pos  flat_threshold = FLAT_THRESHOLD( metrics->units_per_em );


    FT_ZERO( &seg0 );
    seg0.score = 32000;
    seg0.flags = AF_EDGE_NORMAL;

    major_dir   = (AF_Direction)FT_ABS( axis->major_dir );
    segment_dir = major_dir;

    axis->num_segments = 0;

    /* set up (u,v) in each point */
    if ( dim == AF_DIMENSION_HORZ )
    {
      AF_Point  point = hints->points;
      AF_Point  limit = point + hints->num_points;


      for ( ; point < limit; point++ )
      {
        point->u = point->fx;
        point->v = point->fy;
      }
    }
    else
    {
      AF_Point  point = hints->points;
      AF_Point  limit = point + hints->num_points;


      for ( ; point < limit; point++ )
      {
        point->u = point->fy;
        point->v = point->fx;
      }
    }

    /* do each contour separately */
    for ( ; contour < contour_limit; contour++ )
    {
      AF_Point  point   = contour[0];
      AF_Point  last    = point->prev;
      int       on_edge = 0;

      /* we call values measured along a segment (point->v)    */
      /* `coordinates', and values orthogonal to it (point->u) */
      /* `positions'                                           */
      FT_Pos     min_pos      =  32000;
      FT_Pos     max_pos      = -32000;
      FT_Pos     min_coord    =  32000;
      FT_Pos     max_coord    = -32000;
      FT_UShort  min_flags    =  AF_FLAG_NONE;
      FT_UShort  max_flags    =  AF_FLAG_NONE;
      FT_Pos     min_on_coord =  32000;
      FT_Pos     max_on_coord = -32000;

      FT_Bool  passed;

      AF_Segment  prev_segment = NULL;

      FT_Pos     prev_min_pos      = min_pos;
      FT_Pos     prev_max_pos      = max_pos;
      FT_Pos     prev_min_coord    = min_coord;
      FT_Pos     prev_max_coord    = max_coord;
      FT_UShort  prev_min_flags    = min_flags;
      FT_UShort  prev_max_flags    = max_flags;
      FT_Pos     prev_min_on_coord = min_on_coord;
      FT_Pos     prev_max_on_coord = max_on_coord;


      if ( FT_ABS( last->out_dir )  == major_dir &&
           FT_ABS( point->out_dir ) == major_dir )
      {
        /* we are already on an edge, try to locate its start */
        last = point;

        for (;;)
        {
          point = point->prev;
          if ( FT_ABS( point->out_dir ) != major_dir )
          {
            point = point->next;
            break;
          }
          if ( point == last )
            break;
        }
      }

      last   = point;
      passed = 0;

      for (;;)
      {
        FT_Pos  u, v;


        if ( on_edge )
        {
          /* get minimum and maximum position */
          u = point->u;
          if ( u < min_pos )
            min_pos = u;
          if ( u > max_pos )
            max_pos = u;

          /* get minimum and maximum coordinate together with flags */
          v = point->v;
          if ( v < min_coord )
          {
            min_coord = v;
            min_flags = point->flags;
          }
          if ( v > max_coord )
          {
            max_coord = v;
            max_flags = point->flags;
          }

          /* get minimum and maximum coordinate of `on' points */
          if ( !( point->flags & AF_FLAG_CONTROL ) )
          {
            v = point->v;
            if ( v < min_on_coord )
              min_on_coord = v;
            if ( v > max_on_coord )
              max_on_coord = v;
          }

          if ( point->out_dir != segment_dir || point == last )
          {
            /* check whether the new segment's start point is identical to */
            /* the previous segment's end point; for example, this might   */
            /* happen for spikes                                           */

            if ( !prev_segment || segment->first != prev_segment->last )
            {
              /* points are different: we are just leaving an edge, thus */
              /* record a new segment                                    */

              segment->last  = point;
              segment->pos   = (FT_Short)( ( min_pos + max_pos ) >> 1 );
              segment->delta = (FT_Short)( ( max_pos - min_pos ) >> 1 );

              /* a segment is round if either its first or last point */
              /* is a control point, and the length of the on points  */
              /* inbetween doesn't exceed a heuristic limit           */
              if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                   ( max_on_coord - min_on_coord ) < flat_threshold )
                segment->flags |= AF_EDGE_ROUND;

              segment->min_coord = (FT_Short)min_coord;
              segment->max_coord = (FT_Short)max_coord;
              segment->height    = segment->max_coord - segment->min_coord;

              prev_segment      = segment;
              prev_min_pos      = min_pos;
              prev_max_pos      = max_pos;
              prev_min_coord    = min_coord;
              prev_max_coord    = max_coord;
              prev_min_flags    = min_flags;
              prev_max_flags    = max_flags;
              prev_min_on_coord = min_on_coord;
              prev_max_on_coord = max_on_coord;
            }
            else
            {
              /* points are the same: we don't create a new segment but */
              /* merge the current segment with the previous one        */

              if ( prev_segment->last->in_dir == point->in_dir )
              {
                /* we have identical directions (this can happen for       */
                /* degenerate outlines that move zig-zag along the main    */
                /* axis without changing the coordinate value of the other */
                /* axis, and where the segments have just been merged):    */
                /* unify segments                                          */

                /* update constraints */

                if ( prev_min_pos < min_pos )
                  min_pos = prev_min_pos;
                if ( prev_max_pos > max_pos )
                  max_pos = prev_max_pos;

                if ( prev_min_coord < min_coord )
                {
                  min_coord = prev_min_coord;
                  min_flags = prev_min_flags;
                }
                if ( prev_max_coord > max_coord )
                {
                  max_coord = prev_max_coord;
                  max_flags = prev_max_flags;
                }

                if ( prev_min_on_coord < min_on_coord )
                  min_on_coord = prev_min_on_coord;
                if ( prev_max_on_coord > max_on_coord )
                  max_on_coord = prev_max_on_coord;

                prev_segment->last  = point;
                prev_segment->pos   = (FT_Short)( ( min_pos +
                                                    max_pos ) >> 1 );
                prev_segment->delta = (FT_Short)( ( max_pos -
                                                    min_pos ) >> 1 );

                if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                     ( max_on_coord - min_on_coord ) < flat_threshold )
                  prev_segment->flags |= AF_EDGE_ROUND;
                else
                  prev_segment->flags &= ~AF_EDGE_ROUND;

                prev_segment->min_coord = (FT_Short)min_coord;
                prev_segment->max_coord = (FT_Short)max_coord;
                prev_segment->height    = prev_segment->max_coord -
                                          prev_segment->min_coord;
              }
              else
              {
                /* we have different directions; use the properties of the */
                /* longer segment and discard the other one                */

                if ( FT_ABS( prev_max_coord - prev_min_coord ) >
                     FT_ABS( max_coord - min_coord ) )
                {
                  /* discard current segment */

                  if ( min_pos < prev_min_pos )
                    prev_min_pos = min_pos;
                  if ( max_pos > prev_max_pos )
                    prev_max_pos = max_pos;

                  prev_segment->last  = point;
                  prev_segment->pos   = (FT_Short)( ( prev_min_pos +
                                                      prev_max_pos ) >> 1 );
                  prev_segment->delta = (FT_Short)( ( prev_max_pos -
                                                      prev_min_pos ) >> 1 );
                }
                else
                {
                  /* discard previous segment */

                  if ( prev_min_pos < min_pos )
                    min_pos = prev_min_pos;
                  if ( prev_max_pos > max_pos )
                    max_pos = prev_max_pos;

                  segment->last  = point;
                  segment->pos   = (FT_Short)( ( min_pos + max_pos ) >> 1 );
                  segment->delta = (FT_Short)( ( max_pos - min_pos ) >> 1 );

                  if ( ( min_flags | max_flags ) & AF_FLAG_CONTROL      &&
                       ( max_on_coord - min_on_coord ) < flat_threshold )
                    segment->flags |= AF_EDGE_ROUND;

                  segment->min_coord = (FT_Short)min_coord;
                  segment->max_coord = (FT_Short)max_coord;
                  segment->height    = segment->max_coord -
                                       segment->min_coord;

                  *prev_segment = *segment;

                  prev_min_pos      = min_pos;
                  prev_max_pos      = max_pos;
                  prev_min_coord    = min_coord;
                  prev_max_coord    = max_coord;
                  prev_min_flags    = min_flags;
                  prev_max_flags    = max_flags;
                  prev_min_on_coord = min_on_coord;
                  prev_max_on_coord = max_on_coord;
                }
              }

              axis->num_segments--;
            }

            on_edge = 0;
            segment = NULL;

            /* fall through */
          }
        }

        /* now exit if we are at the start/end point */
        if ( point == last )
        {
          if ( passed )
            break;
          passed = 1;
        }

        /* if we are not on an edge, check whether the major direction */
        /* coincides with the current point's `out' direction, or      */
        /* whether we have a single-point contour                      */
        if ( !on_edge                                  &&
             ( FT_ABS( point->out_dir ) == major_dir ||
               point == point->prev                  ) )
        {
          /*
           * For efficiency, we restrict the number of segments to 1000,
           * which is a heuristic value: it is very unlikely that a glyph
           * with so many segments can be hinted in a sensible way.
           * Reasons:
           *
           * - The glyph has really 1000 segments; this implies that it has
           *   at least 2000 outline points.  Assuming 'normal' fonts that
           *   have superfluous points optimized away, viewing such a glyph
           *   only makes sense at large magnifications where hinting
           *   isn't applied anyway.
           *
           * - We have a broken glyph.  Hinting doesn't make sense in this
           *   case either.
           */
          if ( axis->num_segments > 1000 )
          {
            FT_TRACE0(( "af_latin_hints_compute_segments:"
                        " more than 1000 segments in this glyph;\n" ));
            FT_TRACE0(( "                                "
                        " hinting is suppressed\n" ));
            axis->num_segments = 0;
            return FT_Err_Ok;
          }

          /* this is the start of a new segment! */
          segment_dir = (AF_Direction)point->out_dir;

          error = af_axis_hints_new_segment( axis, memory, &segment );
          if ( error )
            goto Exit;

          /* clear all segment fields */
          segment[0] = seg0;

          segment->dir   = (FT_Char)segment_dir;
          segment->first = point;
          segment->last  = point;

          /* `af_axis_hints_new_segment' reallocates memory,    */
          /* thus we have to refresh the `prev_segment' pointer */
          if ( prev_segment )
            prev_segment = segment - 1;

          min_pos   = max_pos   = point->u;
          min_coord = max_coord = point->v;
          min_flags = max_flags = point->flags;

          if ( point->flags & AF_FLAG_CONTROL )
          {
            min_on_coord =  32000;
            max_on_coord = -32000;
          }
          else
            min_on_coord = max_on_coord = point->v;

          on_edge = 1;

          if ( point == point->prev )
          {
            /* we have a one-point segment: this is a one-point */
            /* contour with `in' and `out' direction set to     */
            /* AF_DIR_NONE                                      */
            segment->pos = (FT_Short)min_pos;

            if (point->flags & AF_FLAG_CONTROL)
              segment->flags |= AF_EDGE_ROUND;

            segment->min_coord = (FT_Short)point->v;
            segment->max_coord = (FT_Short)point->v;
            segment->height = 0;

            on_edge = 0;
            segment = NULL;
          }
        }

        point = point->next;
      }

    } /* contours */


    /* now slightly increase the height of segments if this makes */
    /* sense -- this is used to better detect and ignore serifs   */
    {
      AF_Segment  segments     = axis->segments;
      AF_Segment  segments_end = FT_OFFSET( segments, axis->num_segments );


      for ( segment = segments; segment < segments_end; segment++ )
      {
        AF_Point  first   = segment->first;
        AF_Point  last    = segment->last;
        FT_Pos    first_v = first->v;
        FT_Pos    last_v  = last->v;


        if ( first_v < last_v )
        {
          AF_Point  p;


          p = first->prev;
          if ( p->v < first_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( first_v - p->v ) >> 1 ) );

          p = last->next;
          if ( p->v > last_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( p->v - last_v ) >> 1 ) );
        }
        else
        {
          AF_Point  p;


          p = first->prev;
          if ( p->v > first_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( p->v - first_v ) >> 1 ) );

          p = last->next;
          if ( p->v < last_v )
            segment->height = (FT_Short)( segment->height +
                                          ( ( last_v - p->v ) >> 1 ) );
        }
      }
    }

  Exit:
    return error;
  }